

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O3

void __thiscall
llm_build_plm::llm_build_plm
          (llm_build_plm *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint32_t uVar1;
  uint uVar2;
  uint32_t uVar3;
  int iVar4;
  uint32_t uVar5;
  llama_hparams *plVar6;
  ggml_context *pgVar7;
  int64_t iVar8;
  size_t sVar9;
  pointer plVar10;
  ggml_tensor *pgVar11;
  ggml_tensor *pgVar12;
  llm_graph_input_attn_kv_unified *inp;
  ggml_tensor *pgVar13;
  ggml_tensor *pgVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  ggml_tensor *pgVar17;
  undefined8 uVar18;
  ggml_tensor *pgVar19;
  ggml_tensor *cur;
  ggml_tensor *pgVar20;
  long lVar21;
  int il;
  long lVar22;
  int iVar23;
  long lVar24;
  
  llm_graph_context::llm_graph_context(&this->super_llm_graph_context,params);
  plVar6 = (this->super_llm_graph_context).hparams;
  uVar1 = plVar6->n_rot;
  uVar2 = plVar6->n_embd_head_k;
  uVar3 = plVar6->n_lora_kv;
  pgVar11 = llm_graph_context::build_inp_embd(&this->super_llm_graph_context,model->tok_embd);
  pgVar12 = llm_graph_context::build_inp_pos(&this->super_llm_graph_context);
  inp = llm_graph_context::build_attn_inp_kv_unified(&this->super_llm_graph_context);
  if (0 < (this->super_llm_graph_context).n_layer) {
    iVar23 = uVar2 - uVar1;
    lVar21 = 0;
    lVar22 = 0;
    do {
      il = (int)lVar22;
      pgVar13 = llm_graph_context::build_norm
                          (&this->super_llm_graph_context,pgVar11,
                           *(ggml_tensor **)
                            ((long)&((model->layers).
                                     super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->attn_norm + lVar21),
                           (ggml_tensor *)0x0,LLM_NORM_RMS,il);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar13,"attn_norm",il);
      pgVar14 = (ggml_tensor *)
                ggml_mul_mat((this->super_llm_graph_context).ctx0,
                             *(undefined8 *)
                              ((long)&((model->layers).
                                       super__Vector_base<llama_layer,_std::allocator<llama_layer>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->wq + lVar21),
                             pgVar13);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar14,"q",il);
      pgVar7 = (this->super_llm_graph_context).ctx0;
      iVar8 = (this->super_llm_graph_context).n_head;
      iVar4 = (this->super_llm_graph_context).n_tokens;
      uVar15 = ggml_row_size(pgVar14->type,((this->super_llm_graph_context).hparams)->n_embd_head_k)
      ;
      uVar16 = ggml_row_size(pgVar14->type,
                             (ulong)((this->super_llm_graph_context).hparams)->n_embd_head_k *
                             (this->super_llm_graph_context).n_head);
      pgVar17 = (ggml_tensor *)ggml_view_3d(pgVar7,pgVar14,iVar23,iVar8,(long)iVar4,uVar15,uVar16,0)
      ;
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar17,"q_nope",il);
      pgVar7 = (this->super_llm_graph_context).ctx0;
      iVar8 = (this->super_llm_graph_context).n_head;
      iVar4 = (this->super_llm_graph_context).n_tokens;
      uVar15 = ggml_row_size(pgVar14->type,((this->super_llm_graph_context).hparams)->n_embd_head_k)
      ;
      uVar16 = ggml_row_size(pgVar14->type,
                             (ulong)((this->super_llm_graph_context).hparams)->n_embd_head_k *
                             (this->super_llm_graph_context).n_head);
      uVar18 = ggml_row_size(pgVar14->type,iVar23);
      pgVar14 = (ggml_tensor *)
                ggml_view_3d(pgVar7,pgVar14,uVar1,iVar8,(long)iVar4,uVar15,uVar16,uVar18);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar14,"q_pe",il);
      pgVar13 = (ggml_tensor *)
                ggml_mul_mat((this->super_llm_graph_context).ctx0,
                             *(undefined8 *)
                              ((long)&((model->layers).
                                       super__Vector_base<llama_layer,_std::allocator<llama_layer>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->wkv_a_mqa +
                              lVar21),pgVar13);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar13,"kv_pe_compresseed",il);
      pgVar19 = (ggml_tensor *)
                ggml_view_2d((this->super_llm_graph_context).ctx0,pgVar13,uVar3,
                             (long)(this->super_llm_graph_context).n_tokens,pgVar13->nb[1],0);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar19,"kv_compressed",il);
      pgVar7 = (this->super_llm_graph_context).ctx0;
      iVar4 = (this->super_llm_graph_context).n_tokens;
      sVar9 = pgVar13->nb[1];
      uVar15 = ggml_row_size(pgVar13->type,uVar3);
      pgVar13 = (ggml_tensor *)ggml_view_3d(pgVar7,pgVar13,uVar1,1,(long)iVar4,sVar9,sVar9,uVar15);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar13,"k_pe",il);
      pgVar19 = llm_graph_context::build_norm
                          (&this->super_llm_graph_context,pgVar19,
                           *(ggml_tensor **)
                            ((long)&((model->layers).
                                     super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->attn_kv_a_norm +
                            lVar21),(ggml_tensor *)0x0,LLM_NORM_RMS,il);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar19,"kv_compressed",il);
      pgVar19 = (ggml_tensor *)
                ggml_mul_mat((this->super_llm_graph_context).ctx0,
                             *(undefined8 *)
                              ((long)&((model->layers).
                                       super__Vector_base<llama_layer,_std::allocator<llama_layer>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->wkv_b + lVar21),
                             pgVar19);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar19,"kv",il);
      pgVar7 = (this->super_llm_graph_context).ctx0;
      iVar8 = (this->super_llm_graph_context).n_head;
      iVar4 = (this->super_llm_graph_context).n_tokens;
      uVar15 = ggml_row_size(pgVar19->type,
                             ((this->super_llm_graph_context).hparams)->n_embd_head_v + iVar23);
      uVar16 = ggml_row_size(pgVar19->type,
                             (ulong)(((this->super_llm_graph_context).hparams)->n_embd_head_v +
                                    iVar23) * (this->super_llm_graph_context).n_head);
      cur = (ggml_tensor *)ggml_view_3d(pgVar7,pgVar19,iVar23,iVar8,(long)iVar4,uVar15,uVar16,0);
      llm_graph_context::cb(&this->super_llm_graph_context,cur,"k_nope",il);
      pgVar7 = (this->super_llm_graph_context).ctx0;
      iVar8 = (this->super_llm_graph_context).n_head;
      uVar5 = ((this->super_llm_graph_context).hparams)->n_embd_head_v;
      iVar4 = (this->super_llm_graph_context).n_tokens;
      uVar15 = ggml_row_size(pgVar19->type,iVar23 + uVar5);
      uVar16 = ggml_row_size(pgVar19->type,
                             (ulong)(((this->super_llm_graph_context).hparams)->n_embd_head_v +
                                    iVar23) * (this->super_llm_graph_context).n_head);
      uVar18 = ggml_row_size(pgVar19->type,iVar23);
      pgVar20 = (ggml_tensor *)
                ggml_view_3d(pgVar7,pgVar19,uVar5,iVar8,(long)iVar4,uVar15,uVar16,uVar18);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar20,"v_states",il);
      pgVar20 = (ggml_tensor *)ggml_cont((this->super_llm_graph_context).ctx0,pgVar20);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar20,"v_states",il);
      pgVar7 = (this->super_llm_graph_context).ctx0;
      lVar24 = (ulong)((this->super_llm_graph_context).hparams)->n_embd_head_v *
               (this->super_llm_graph_context).n_head;
      iVar4 = (this->super_llm_graph_context).n_tokens;
      uVar15 = ggml_row_size(pgVar19->type,lVar24);
      pgVar19 = (ggml_tensor *)ggml_view_2d(pgVar7,pgVar20,lVar24,(long)iVar4,uVar15,0);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar19,"v_states",il);
      pgVar14 = (ggml_tensor *)
                ggml_rope_ext((this->super_llm_graph_context).freq_base,
                              (this->super_llm_graph_context).freq_scale,
                              (this->super_llm_graph_context).ext_factor,
                              (this->super_llm_graph_context).attn_factor,
                              (this->super_llm_graph_context).beta_fast,
                              (this->super_llm_graph_context).beta_slow,
                              (this->super_llm_graph_context).ctx0,pgVar14,pgVar12,0,
                              (int)(this->super_llm_graph_context).n_rot,
                              (this->super_llm_graph_context).rope_type,
                              (this->super_llm_graph_context).n_ctx_orig);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar14,"q_pe",il);
      pgVar13 = (ggml_tensor *)
                ggml_rope_ext((this->super_llm_graph_context).freq_base,
                              (this->super_llm_graph_context).freq_scale,
                              (this->super_llm_graph_context).ext_factor,
                              (this->super_llm_graph_context).attn_factor,
                              (this->super_llm_graph_context).beta_fast,
                              (this->super_llm_graph_context).beta_slow,
                              (this->super_llm_graph_context).ctx0,pgVar13,pgVar12,0,
                              (int)(this->super_llm_graph_context).n_rot,
                              (this->super_llm_graph_context).rope_type,
                              (this->super_llm_graph_context).n_ctx_orig);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar13,"k_pe",il);
      pgVar17 = (ggml_tensor *)ggml_concat((this->super_llm_graph_context).ctx0,pgVar17,pgVar14,0);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar17,"q_states",il);
      pgVar7 = (this->super_llm_graph_context).ctx0;
      uVar15 = ggml_repeat(pgVar7,pgVar13,pgVar14);
      pgVar13 = (ggml_tensor *)ggml_concat(pgVar7,cur,uVar15,0);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar13,"k_states",il);
      pgVar13 = llm_graph_context::build_attn
                          (&this->super_llm_graph_context,inp,gf,
                           *(ggml_tensor **)
                            ((long)&((model->layers).
                                     super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->wo + lVar21),
                           (ggml_tensor *)0x0,pgVar17,pgVar13,pgVar19,(ggml_tensor *)0x0,
                           (ggml_tensor *)0x0,1.0 / SQRT((float)uVar2),il);
      if (lVar22 == (this->super_llm_graph_context).n_layer + -1) {
        pgVar14 = llm_graph_context::build_inp_out_ids(&this->super_llm_graph_context);
        pgVar13 = (ggml_tensor *)ggml_get_rows((this->super_llm_graph_context).ctx0,pgVar13,pgVar14)
        ;
        pgVar11 = (ggml_tensor *)ggml_get_rows((this->super_llm_graph_context).ctx0,pgVar11,pgVar14)
        ;
      }
      pgVar11 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar13,pgVar11);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar11,"ffn_inp",il);
      pgVar13 = llm_graph_context::build_norm
                          (&this->super_llm_graph_context,pgVar11,
                           *(ggml_tensor **)
                            ((long)&((model->layers).
                                     super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->ffn_norm + lVar21),
                           (ggml_tensor *)0x0,LLM_NORM_RMS,il);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar13,"ffn_norm",il);
      plVar10 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pgVar13 = llm_graph_context::build_ffn
                          (&this->super_llm_graph_context,pgVar13,
                           *(ggml_tensor **)((long)&plVar10->ffn_up + lVar21),(ggml_tensor *)0x0,
                           (ggml_tensor *)0x0,(ggml_tensor *)0x0,(ggml_tensor *)0x0,
                           (ggml_tensor *)0x0,*(ggml_tensor **)((long)&plVar10->ffn_down + lVar21),
                           (ggml_tensor *)0x0,(ggml_tensor *)0x0,(ggml_tensor *)0x0,LLM_FFN_RELU_SQR
                           ,LLM_FFN_SEQ,il);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar13,"ffn_out",il);
      pgVar11 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar13,pgVar11);
      pgVar11 = llm_graph_context::build_cvec(&this->super_llm_graph_context,pgVar11,il);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar11,"l_out",il);
      lVar22 = lVar22 + 1;
      lVar21 = lVar21 + 0x4f0;
    } while (lVar22 < (this->super_llm_graph_context).n_layer);
  }
  pgVar12 = llm_graph_context::build_norm
                      (&this->super_llm_graph_context,pgVar11,model->output_norm,(ggml_tensor *)0x0,
                       LLM_NORM_RMS,-1);
  llm_graph_context::cb(&this->super_llm_graph_context,pgVar12,"result_norm",-1);
  ((this->super_llm_graph_context).res._M_t.
   super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
   super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
   super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_embd = pgVar12;
  pgVar12 = llm_graph_context::build_lora_mm(&this->super_llm_graph_context,model->output,pgVar12);
  llm_graph_context::cb(&this->super_llm_graph_context,pgVar12,"result_output",-1);
  ((this->super_llm_graph_context).res._M_t.
   super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
   super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
   super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_logits = pgVar12;
  ggml_build_forward_expand(gf,pgVar12);
  return;
}

Assistant:

llm_build_plm(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const float kq_scale = 1.0f/sqrtf(float(hparams.n_embd_head_k));

        const uint32_t n_embd_head_qk_rope = hparams.n_rot;
        const uint32_t n_embd_head_qk_nope = hparams.n_embd_head_k - hparams.n_rot;
        const uint32_t kv_lora_rank = hparams.n_lora_kv;

        ggml_tensor * cur;
        ggml_tensor * inpL;

        // {n_embd, n_tokens}
        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            ggml_tensor * inpSA = inpL;

            // norm
            cur = build_norm(inpL,
                    model.layers[il].attn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "attn_norm", il);

            // self_attention
            {
                ggml_tensor * q = NULL;
                q = ggml_mul_mat(ctx0, model.layers[il].wq, cur);
                cb(q, "q", il);

                // split into {n_head * n_embd_head_qk_nope, n_tokens}
                ggml_tensor * q_nope = ggml_view_3d(ctx0, q, n_embd_head_qk_nope, n_head, n_tokens,
                        ggml_row_size(q->type, hparams.n_embd_head_k),
                        ggml_row_size(q->type, hparams.n_embd_head_k * n_head),
                        0);
                cb(q_nope, "q_nope", il);

                // and {n_head * n_embd_head_qk_rope, n_tokens}
                ggml_tensor * q_pe = ggml_view_3d(ctx0, q, n_embd_head_qk_rope, n_head, n_tokens,
                        ggml_row_size(q->type, hparams.n_embd_head_k),
                        ggml_row_size(q->type, hparams.n_embd_head_k * n_head),
                        ggml_row_size(q->type, n_embd_head_qk_nope));
                cb(q_pe, "q_pe", il);

                // {n_embd, kv_lora_rank + n_embd_head_qk_rope} * {n_embd, n_tokens} -> {kv_lora_rank + n_embd_head_qk_rope, n_tokens}
                ggml_tensor * kv_pe_compresseed = ggml_mul_mat(ctx0, model.layers[il].wkv_a_mqa, cur);
                cb(kv_pe_compresseed, "kv_pe_compresseed", il);

                // split into {kv_lora_rank, n_tokens}
                ggml_tensor * kv_compressed = ggml_view_2d(ctx0, kv_pe_compresseed, kv_lora_rank, n_tokens,
                        kv_pe_compresseed->nb[1],
                        0);
                cb(kv_compressed, "kv_compressed", il);

                // and {n_embd_head_qk_rope, n_tokens}
                ggml_tensor * k_pe = ggml_view_3d(ctx0, kv_pe_compresseed, n_embd_head_qk_rope, 1, n_tokens,
                        kv_pe_compresseed->nb[1],
                        kv_pe_compresseed->nb[1],
                        ggml_row_size(kv_pe_compresseed->type, kv_lora_rank));
                cb(k_pe, "k_pe", il);

                kv_compressed = build_norm(kv_compressed,
                        model.layers[il].attn_kv_a_norm, NULL,
                        LLM_NORM_RMS, il);
                cb(kv_compressed, "kv_compressed", il);

                // {kv_lora_rank, n_head * (n_embd_head_qk_nope + n_embd_head_v)} * {kv_lora_rank, n_tokens} -> {n_head * (n_embd_head_qk_nope + n_embd_head_v), n_tokens}
                ggml_tensor * kv = ggml_mul_mat(ctx0, model.layers[il].wkv_b, kv_compressed);
                cb(kv, "kv", il);

                // split into {n_head * n_embd_head_qk_nope, n_tokens}
                ggml_tensor * k_nope = ggml_view_3d(ctx0, kv, n_embd_head_qk_nope, n_head, n_tokens,
                        ggml_row_size(kv->type, n_embd_head_qk_nope + hparams.n_embd_head_v),
                        ggml_row_size(kv->type, n_head * (n_embd_head_qk_nope + hparams.n_embd_head_v)),
                        0);
                cb(k_nope, "k_nope", il);

                // and {n_head * n_embd_head_v, n_tokens}
                ggml_tensor * v_states = ggml_view_3d(ctx0, kv, hparams.n_embd_head_v, n_head, n_tokens,
                        ggml_row_size(kv->type, (n_embd_head_qk_nope + hparams.n_embd_head_v)),
                        ggml_row_size(kv->type, (n_embd_head_qk_nope + hparams.n_embd_head_v)*n_head),
                        ggml_row_size(kv->type, (n_embd_head_qk_nope)));
                cb(v_states, "v_states", il);

                v_states = ggml_cont(ctx0, v_states);
                cb(v_states, "v_states", il);

                v_states = ggml_view_2d(ctx0, v_states, hparams.n_embd_head_v * n_head, n_tokens,
                        ggml_row_size(kv->type, hparams.n_embd_head_v * n_head),
                        0);
                cb(v_states, "v_states", il);

                q_pe = ggml_rope_ext(
                        ctx0, q_pe, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );
                cb(q_pe, "q_pe", il);

                // shared RoPE key
                k_pe = ggml_rope_ext(
                        ctx0, k_pe, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );
                cb(k_pe, "k_pe", il);

                ggml_tensor * q_states = ggml_concat(ctx0, q_nope, q_pe, 0);
                cb(q_states, "q_states", il);

                ggml_tensor * k_states = ggml_concat(ctx0, k_nope, ggml_repeat(ctx0, k_pe, q_pe), 0);
                cb(k_states, "k_states", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, NULL,
                        q_states, k_states, v_states, nullptr, nullptr, kq_scale, il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur   = ggml_get_rows(ctx0,   cur, inp_out_ids);
                inpSA = ggml_get_rows(ctx0, inpSA, inp_out_ids);
            }

            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpSA);
            cb(ffn_inp, "ffn_inp", il);

            cur = build_norm(ffn_inp,
                    model.layers[il].ffn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "ffn_norm", il);

            cur = build_ffn(cur,
                    model.layers[il].ffn_up,   NULL, NULL,
                    NULL, NULL, NULL,
                    model.layers[il].ffn_down, NULL, NULL,
                    NULL,
                    LLM_FFN_RELU_SQR, LLM_FFN_SEQ, il);
            cb(cur, "ffn_out", il);

            cur = ggml_add(ctx0, cur, ffn_inp);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;

        cur = build_norm(cur,
                model.output_norm, NULL,
                LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }